

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

StatementMap *
Js::FunctionBody::
GetNextNonSubexpressionStatementMap<JsUtil::List<Js::FunctionBody::StatementMap*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>>
          (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *statementMapList,int *startingAtIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  StatementMap *pSVar5;
  int index;
  
  if (statementMapList ==
      (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xb3a,"(statementMapList != nullptr)",
                                "Must have valid statementMapList to execute");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pTVar4 = JsUtil::
           List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           ::Item(statementMapList,*startingAtIndex);
  pSVar5 = pTVar4->ptr;
  if (pSVar5->isSubexpression == true) {
    do {
      if ((statementMapList->
          super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>).
          count + -1 <= *startingAtIndex) {
        return (StatementMap *)0x0;
      }
      index = *startingAtIndex + 1;
      *startingAtIndex = index;
      pTVar4 = JsUtil::
               List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(statementMapList,index);
      pSVar5 = pTVar4->ptr;
    } while (pSVar5->isSubexpression != false);
  }
  return pSVar5;
}

Assistant:

FunctionBody::StatementMap * FunctionBody::GetNextNonSubexpressionStatementMap(TStatementMapList *statementMapList, int & startingAtIndex)
    {
        AssertMsg(statementMapList != nullptr, "Must have valid statementMapList to execute");

        FunctionBody::StatementMap *map = statementMapList->Item(startingAtIndex);
        while (map->isSubexpression && startingAtIndex < statementMapList->Count() - 1)
        {
            map = statementMapList->Item(++startingAtIndex);
        }
        if (map->isSubexpression)   // Didn't find any non inner maps
        {
            return nullptr;
        }
        return map;
    }